

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

int rackH2(void)

{
  difference_type dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int bal;
  int num_vowels;
  int iStack_7c;
  char c;
  int i_1;
  int i;
  int freq [27];
  int sum;
  
  freq[0x19] = 0;
  iStack_7c = 0x1b;
  while (iVar2 = iStack_7c + -1, iStack_7c != 0) {
    (&i_1)[iVar2] = 0;
    iStack_7c = iVar2;
  }
  num_vowels = rack_size;
  while (iVar3 = num_vowels + -1, num_vowels != 0) {
    (&i_1)[rack[iVar3] + -0x41] = (&i_1)[rack[iVar3] + -0x41] + 1;
    num_vowels = iVar3;
  }
  for (bal._3_1_ = 'A'; bal._3_1_ < '\\'; bal._3_1_ = bal._3_1_ + '\x01') {
    if ((&i_1)[bal._3_1_ + -0x41] != 0) {
      freq[0x19] = (&i_1)[bal._3_1_ + -0x41] *
                   (H2[bal._3_1_ + -0x41][0] +
                   (((&i_1)[bal._3_1_ + -0x41] + -1) * H2[bal._3_1_ + -0x41][1]) / 2) + freq[0x19];
    }
  }
  bal._2_1_ = 0x55;
  num_vowels = iVar3;
  iStack_7c = iVar2;
  dVar1 = std::count<char*,char>(rack,rack + rack_size,(char *)((long)&bal + 2));
  bVar4 = false;
  if (dVar1 != 0) {
    bal._1_1_ = 0x51;
    dVar1 = std::count<char*,char>(rack,rack + rack_size,(char *)((long)&bal + 1));
    bVar4 = dVar1 != 0;
  }
  if (bVar4) {
    freq[0x19] = freq[0x19] + 0x5dc;
  }
  iVar2 = rack_size + (i_1 + freq[2] + freq[6] + freq[0xc] + freq[0x12]) * -2 + -1;
  return freq[0x19] + iVar2 * iVar2 * -0x32;
}

Assistant:

int rackH2() {
    int sum = 0;
    int freq[27];
    for (int i = 27; i--;) freq[i] = 0;
    for (int i = rack_size; i--;) {
        freq[rack[i] - 'A']++;
    }
    for (char c = 'A'; c <= 'A' + 26; c++) {
        if (freq[c - 'A'])
            sum += freq[c - 'A'] * (H2[c - 'A'][0] + (freq[c - 'A'] - 1) * H2[c - 'A'][1] / 2);
    }
    if (std::count(rack, rack + rack_size, 'U') && std::count(rack, rack + rack_size, 'Q')) sum += 1500;

    // vowels: A,E,I,O,U
    int num_vowels = freq[0] + freq['E' - 'A'] + freq['I' - 'A'] + freq['O' - 'A'] + freq['U' - 'A'];
    // consonants - vowels balance
    int bal = rack_size - num_vowels * 2 - 1; // ideally 3 vowels and 4 consonants
    sum -= bal * bal * 50; // max -2450 for 6 vowel leave
    return sum;
}